

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

int cppcms_capi_session_set_binary(cppcms_capi_session *session,char *key,void *value,int length)

{
  session_interface *this;
  string *psVar1;
  invalid_argument *this_00;
  allocator local_51;
  string local_50;
  
  if (session == (cppcms_capi_session *)0x0) {
    return -1;
  }
  anon_unknown.dwarf_41bcbf::check_str(key);
  if (value == (void *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"value is null");
  }
  else {
    if (-1 < length) {
      cppcms_capi_session::check_loaded_unsaved(session);
      this = (session->p).ptr_;
      std::__cxx11::string::string((string *)&local_50,key,&local_51);
      psVar1 = cppcms::session_interface::operator[](this,&local_50);
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)psVar1->_M_string_length,(ulong)value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return 0;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"length is negative");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int cppcms_capi_session_set_binary(cppcms_capi_session *session,char const *key,void const *value,int length)
{
	TRY {
		if(!session)
			return -1;
		check_str(key);
		if(!value)
			throw std::invalid_argument("value is null");
		if(length < 0)
			throw std::invalid_argument("length is negative");
		session->check_loaded_unsaved();
		(*(session->p))[key].assign(static_cast<char const *>(value),size_t(length));
	}